

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

bool __thiscall
Js::ProbeContainer::GetNextUserStatementOffsetHelper
          (ProbeContainer *this,FunctionBody *functionBody,int currentOffset,
          StatementAdjustmentType adjType,int *nextStatementOffset)

{
  uint start;
  StatementMap *pSVar1;
  code *pcVar2;
  uint *puVar3;
  bool bVar4;
  StatementAdjustmentType SVar5;
  int iVar6;
  BOOL BVar7;
  uint uVar8;
  undefined4 *puVar9;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type *pTVar10;
  StatementMap *pSVar11;
  undefined6 in_register_0000000a;
  int iVar12;
  int local_48;
  undefined4 local_44;
  uint *local_40;
  StatementAdjustmentRecord local_38;
  StatementAdjustmentRecord adjRecord;
  
  local_44 = (undefined4)CONCAT62(in_register_0000000a,adjType);
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x2e2,"(functionBody)","functionBody");
    if (!bVar4) goto LAB_007fe0e3;
    *puVar9 = 0;
  }
  if (nextStatementOffset == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x2e3,"(nextStatementOffset)","nextStatementOffset");
    if (!bVar4) {
LAB_007fe0e3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  local_40 = (uint *)nextStatementOffset;
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                         ((FunctionProxy *)functionBody);
  if ((this_00 !=
       (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (iVar6 = (this_00->
              super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
              ).count, 1 < iVar6)) {
    for (iVar12 = 1; iVar12 + -1 < iVar6 + -1; iVar12 = iVar12 + 1) {
      pTVar10 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar12 + -1);
      pSVar1 = pTVar10->ptr;
      if ((pSVar1->isSubexpression == false) &&
         (bVar4 = regex::Interval::Includes(&pSVar1->byteCodeSpan,currentOffset), bVar4)) {
        local_48 = iVar12;
        pSVar11 = FunctionBody::
                  GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                            (this_00,&local_48);
        if (pSVar11 != (StatementMap *)0x0) {
          FunctionBody::StatementAdjustmentRecord::StatementAdjustmentRecord(&local_38);
          uVar8 = (pSVar11->byteCodeSpan).begin;
          start = (pSVar1->byteCodeSpan).end;
          if (((int)start < (int)uVar8) &&
             (BVar7 = FunctionBody::GetBranchOffsetWithin(functionBody,start,uVar8,&local_38),
             BVar7 != 0)) {
            SVar5 = FunctionBody::StatementAdjustmentRecord::GetAdjustmentType(&local_38);
            if (((StatementAdjustmentType)local_44 & SVar5) != SAT_None) {
              uVar8 = FunctionBody::StatementAdjustmentRecord::GetByteCodeOffset(&local_38);
              puVar3 = local_40;
              if (uVar8 <= (uint)(pSVar1->byteCodeSpan).end) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar9 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                            ,0x2fb,
                                            "(adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end)"
                                            ,
                                            "adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end"
                                           );
                if (!bVar4) goto LAB_007fe0e3;
                *puVar9 = 0;
              }
              uVar8 = FunctionBody::StatementAdjustmentRecord::GetByteCodeOffset(&local_38);
              local_40 = puVar3;
              goto LAB_007fe0dd;
            }
          }
          uVar8 = (pSVar11->byteCodeSpan).begin;
LAB_007fe0dd:
          *local_40 = uVar8;
          return true;
        }
        break;
      }
      iVar6 = (this_00->
              super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
              ).count;
    }
  }
  *local_40 = 0xffffffff;
  return false;
}

Assistant:

bool ProbeContainer::GetNextUserStatementOffsetHelper(
        Js::FunctionBody* functionBody, int currentOffset, FunctionBody::StatementAdjustmentType adjType, int* nextStatementOffset)
    {
        Assert(functionBody);
        Assert(nextStatementOffset);

        FunctionBody::StatementMapList* pStatementMaps = functionBody->GetStatementMaps();
        if (pStatementMaps && pStatementMaps->Count() > 1)
        {
            for (int index = 0; index < pStatementMaps->Count() - 1; index++)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!pStatementMap->isSubexpression && pStatementMap->byteCodeSpan.Includes(currentOffset))
                {
                    int nextMapIndex = index;
                    FunctionBody::StatementMap* pNextStatementMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(pStatementMaps, ++nextMapIndex);
                    if (!pNextStatementMap)
                    {
                        break;
                    }

                    // We are trying to find out the Branch opcode, between current and next statement. Skipping that would give use incorrect execution order.
                    FunctionBody::StatementAdjustmentRecord adjRecord;
                    if (pNextStatementMap->byteCodeSpan.begin > pStatementMap->byteCodeSpan.end &&
                        functionBody->GetBranchOffsetWithin(pStatementMap->byteCodeSpan.end, pNextStatementMap->byteCodeSpan.begin, &adjRecord) &&
                        (adjRecord.GetAdjustmentType() & adjType))
                    {
                        Assert(adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end);
                        *nextStatementOffset = adjRecord.GetByteCodeOffset();
                    }
                    else
                    {
                        *nextStatementOffset = pNextStatementMap->byteCodeSpan.begin;
                    }
                    return true;
                }
            }
        }

        *nextStatementOffset = -1;
        return false;
    }